

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dgArray.h
# Opt level: O1

dgBigVector * __thiscall dgArray<dgBigVector>::operator[](dgArray<dgBigVector> *this,HaI32 i)

{
  if (-1 < i) {
    while (this->m_maxSize <= i) {
      Resize(this,i);
    }
    return this->m_array + (uint)i;
  }
  __assert_fail("i >= 0",
                "/workspace/llm4binary/github/license_all_cmakelists_25/cecilysunday[P]chrono/src/chrono_thirdparty/HACDv2/dgArray.h"
                ,0x59,"T &dgArray<dgBigVector>::operator[](hacd::HaI32) [T = dgBigVector]");
}

Assistant:

T& dgArray<T>::operator[] (hacd::HaI32 i)
{
	HACD_ASSERT (i >= 0);
	while (i >= m_maxSize) {
		Resize (i);
	}
	return m_array[i];
}